

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  cmLocalGenerator *localGenerator;
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  pointer pbVar3;
  int iVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar6;
  size_t sVar7;
  cmGeneratorExpressionInterpreter *this;
  char *pcVar8;
  ostream *poVar9;
  pointer ppcVar10;
  char *__s;
  bool bVar11;
  pair<bool,_const_char_*> pVar12;
  string reportEntry;
  string report;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  char *local_2f0;
  cmGeneratorExpressionInterpreter *local_2d8;
  string local_2d0;
  cmGeneratorTarget *local_2b0;
  string local_2a8;
  string local_288;
  _Base_ptr local_268;
  _Base_ptr local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  char *local_248;
  pointer local_240;
  undefined1 local_238 [112];
  ios_base local_1c8 [264];
  string local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_248 = defaultValue;
  local_2f0 = cmGeneratorTarget::GetProperty(tgt,p);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,tgt);
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar11 = _Var5._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_260 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_258 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_268 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_250 = _Var5._M_current;
  if (local_260 != local_268 &&
      _Var5._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11f0,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  pvVar6 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_288,(ulong)(tgt->Target->Name)._M_dataplus._M_p);
    local_2b0 = tgt;
    if (local_250 != local_258) {
      std::__cxx11::string::append((char *)&local_288);
      pcVar8 = "(unset)";
      if (local_2f0 != (char *)0x0) {
        pcVar8 = local_2f0;
      }
      local_238._0_8_ = local_238 + 0x10;
      sVar7 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,pcVar8,pcVar8 + sVar7);
      std::__cxx11::string::_M_append((char *)&local_288,local_238._0_8_);
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
    }
    pcVar2 = local_2b0;
    std::__cxx11::string::append((char *)&local_288);
    std::operator+(&local_68,"INTERFACE_",p);
    iVar4 = std::__cxx11::string::compare((char *)p);
    if (iVar4 == 0) {
      this = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      localGenerator = pcVar2->LocalGenerator;
      pcVar1 = (config->_M_dataplus)._M_p;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar1,pcVar1 + config->_M_string_length);
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (this,localGenerator,&local_c0,pcVar2,&local_88);
      local_2d8 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_2d8 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    ppcVar10 = (pvVar6->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_240 = (pvVar6->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar10 != local_240) {
      do {
        pcVar2 = *ppcVar10;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_a0,pcVar2);
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar3 = local_a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar8 = getTypedProperty<char_const*>(pcVar2,&local_68,local_2d8);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        local_2d0._M_string_length = 0;
        local_2d0.field_2._M_local_buf[0] = '\0';
        if (_Var5._M_current == pbVar3) {
          pcVar8 = local_2f0;
          if (local_260 != local_268) {
            pcVar8 = "";
          }
          if (local_250 == local_258) {
            local_2f0 = pcVar8;
          }
          iVar4 = 3;
        }
        else {
          std::__cxx11::string::append((char *)&local_2d0);
          std::__cxx11::string::_M_append
                    ((char *)&local_2d0,(ulong)(pcVar2->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_2d0);
          __s = pcVar8;
          if (pcVar8 == (char *)0x0) {
            __s = "(unset)";
          }
          local_238._0_8_ = local_238 + 0x10;
          sVar7 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_238,__s,__s + sVar7);
          std::__cxx11::string::_M_append((char *)&local_2d0,local_238._0_8_);
          if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
            operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&local_2d0);
          if (local_250 == local_258) {
            if (local_260 == local_268) {
              if (bVar11) {
                pVar12 = consistentProperty<char_const*>(local_2f0,pcVar8,t);
                pcVar8 = pVar12.second;
                std::__cxx11::string::_M_append
                          ((char *)&local_288,(ulong)local_2d0._M_dataplus._M_p);
                compatibilityAgree_abi_cxx11_((string *)local_238,t,local_2f0 != pcVar8);
                std::__cxx11::string::_M_append((char *)&local_288,local_238._0_8_);
                if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                  operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
                }
                bVar11 = true;
                if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_238,"The INTERFACE_",0xe);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_238,(p->_M_dataplus)._M_p,p->_M_string_length
                                     );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," property of \"",0xe);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar9,(pcVar2->Target->Name)._M_dataplus._M_p,
                                      (pcVar2->Target->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"\" does\nnot agree with the value of ",0x23);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar9,(p->_M_dataplus)._M_p,p->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9," already determined\nfor \"",0x19);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar9,(local_2b0->Target->Name)._M_dataplus._M_p,
                                      (local_2b0->Target->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".\n",3);
                  std::__cxx11::stringbuf::str();
                  cmSystemTools::Error(&local_2a8);
                  goto LAB_002d2e24;
                }
                goto LAB_002d2c13;
              }
              local_238._0_8_ = local_238 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_238,local_2d0._M_dataplus._M_p,
                         local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
              std::__cxx11::string::append((char *)local_238);
              std::__cxx11::string::_M_append((char *)&local_288,local_238._0_8_);
              if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
              }
              iVar4 = 0;
              bVar11 = true;
              local_2f0 = pcVar8;
            }
            else {
              pVar12 = consistentProperty<char_const*>("",pcVar8,t);
              std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2d0._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_((string *)local_238,t,pVar12.second != "");
              std::__cxx11::string::_M_append((char *)&local_288,local_238._0_8_);
              if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
              }
              if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_238,"Property ",9);
                pcVar8 = local_248;
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_238,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," on target \"",0xc);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(local_2b0->Target->Name)._M_dataplus._M_p,
                                    (local_2b0->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"\" is\nimplied to be ",0x13);
                if (pcVar8 == (char *)0x0) {
                  std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar7 = strlen(pcVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,sVar7);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9," property on\ndependency \"",0x19);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(pcVar2->Target->Name)._M_dataplus._M_p,
                                    (pcVar2->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_2a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                  operator_delete(local_2a8._M_dataplus._M_p,
                                  local_2a8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
                std::ios_base::~ios_base(local_1c8);
                iVar4 = 2;
                local_2f0 = "";
              }
              else {
                iVar4 = 3;
                local_2f0 = pVar12.second;
              }
            }
          }
          else {
            pVar12 = consistentProperty<char_const*>(local_2f0,pcVar8,t);
            pcVar8 = pVar12.second;
            std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2d0._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_((string *)local_238,t,local_2f0 != pcVar8);
            std::__cxx11::string::_M_append((char *)&local_288,local_238._0_8_);
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
              operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
            }
            if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Property ",9)
              ;
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_238,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," on target \"",0xc);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,(local_2b0->Target->Name)._M_dataplus._M_p,
                                  (local_2b0->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"\" does\nnot match the INTERFACE_",0x1f);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9," property requirement\nof dependency \"",0x25);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,(pcVar2->Target->Name)._M_dataplus._M_p,
                                  (pcVar2->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_2a8);
LAB_002d2e24:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
              std::ios_base::~ios_base(local_1c8);
              iVar4 = 2;
            }
            else {
LAB_002d2c13:
              iVar4 = 3;
              local_2f0 = pcVar8;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,
                          CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                   local_2d0.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0);
      } while (((iVar4 == 3) || (iVar4 == 0)) && (ppcVar10 = ppcVar10 + 1, ppcVar10 != local_240));
    }
    pcVar8 = "(unset)";
    if (local_2f0 != (char *)0x0) {
      pcVar8 = local_2f0;
    }
    local_238._0_8_ = local_238 + 0x10;
    sVar7 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,pcVar8,pcVar8 + sVar7);
    compatibilityType_abi_cxx11_(&local_2d0,t);
    cmGeneratorTarget::ReportPropertyOrigin(local_2b0,p,(string *)local_238,&local_288,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,
                      CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                               local_2d0.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if (local_2d8 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2d8,local_2d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2f0;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}